

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtdc(int grouptype,int xtensioncol,int extnamecol,int extvercol,int positioncol,
          int locationcol,int uricol,char **ttype,char **tform,int *ncols,int *status)

{
  char local_bd [8];
  char locTform [5];
  char location [16];
  char local_9b [8];
  char URITform [3];
  char URI [16];
  char local_7b [8];
  char posTform [3];
  char position [16];
  char local_5d [8];
  char verTform [3];
  char version [15];
  char nameTform [4];
  char name [12];
  char xtenTform [3];
  char xtension [16];
  int i;
  int locationcol_local;
  int positioncol_local;
  int extvercol_local;
  int extnamecol_local;
  int xtensioncol_local;
  int grouptype_local;
  
  xtension[8] = '\0';
  xtension[9] = '\0';
  xtension[10] = '\0';
  xtension[0xb] = '\0';
  name[7] = 'M';
  name[8] = 'E';
  name[9] = 'M';
  name[10] = 'B';
  name[0xb] = 'E';
  xtenTform[0] = 'R';
  xtenTform[1] = '_';
  xtenTform[2] = 'X';
  name[4] = '8';
  name[5] = 'A';
  name[6] = '\0';
  builtin_strncpy(version + 0xb,"MEMB",4);
  builtin_strncpy(nameTform,"ER_N",4);
  builtin_strncpy(name,"AME",4);
  builtin_strncpy(version + 7,"32A",4);
  local_5d[3] = 'M';
  local_5d[4] = 'E';
  local_5d[5] = 'M';
  local_5d[6] = 'B';
  local_5d[7] = 'E';
  verTform[0] = 'R';
  verTform[1] = '_';
  verTform[2] = 'V';
  builtin_strncpy(version,"ERSION",7);
  local_5d[0] = '1';
  local_5d[1] = 'J';
  local_5d[2] = 0;
  local_7b[3] = 'M';
  local_7b[4] = 'E';
  local_7b[5] = 'M';
  local_7b[6] = 'B';
  local_7b[7] = 'E';
  posTform[0] = 'R';
  posTform[1] = '_';
  posTform[2] = 'P';
  local_7b[0] = '1';
  local_7b[1] = 'J';
  local_7b[2] = 0;
  local_9b[3] = 'M';
  local_9b[4] = 'E';
  local_9b[5] = 'M';
  local_9b[6] = 'B';
  local_9b[7] = 'E';
  URITform[0] = 'R';
  URITform[1] = '_';
  URITform[2] = 'U';
  local_9b[0] = '3';
  local_9b[1] = 'A';
  local_9b[2] = 0;
  local_bd[5] = 'M';
  local_bd[6] = 'E';
  local_bd[7] = 'M';
  builtin_strncpy(locTform,"BER_L",5);
  builtin_strncpy(local_bd,"256A",5);
  if (*status == 0) {
    switch(grouptype) {
    case 0:
      if (xtensioncol == 0) {
        strcpy(*ttype,name + 7);
        strcpy(*tform,name + 4);
      }
      xtension[9] = '\0';
      xtension[10] = '\0';
      xtension[0xb] = '\0';
      xtension[8] = xtensioncol == 0;
      if (extnamecol == 0) {
        strcpy(ttype[(int)xtension._8_4_],version + 0xb);
        strcpy(tform[(int)xtension._8_4_],version + 7);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      if (extvercol == 0) {
        strcpy(ttype[(int)xtension._8_4_],local_5d + 3);
        strcpy(tform[(int)xtension._8_4_],local_5d);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      if (positioncol == 0) {
        strcpy(ttype[(int)xtension._8_4_],local_7b + 3);
        strcpy(tform[(int)xtension._8_4_],local_7b);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      if (locationcol == 0) {
        strcpy(ttype[(int)xtension._8_4_],local_bd + 5);
        strcpy(tform[(int)xtension._8_4_],local_bd);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      if (uricol == 0) {
        strcpy(ttype[(int)xtension._8_4_],local_9b + 3);
        strcpy(tform[(int)xtension._8_4_],local_9b);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      break;
    case 1:
      if (xtensioncol == 0) {
        strcpy(*ttype,name + 7);
        strcpy(*tform,name + 4);
      }
      xtension[9] = '\0';
      xtension[10] = '\0';
      xtension[0xb] = '\0';
      xtension[8] = xtensioncol == 0;
      if (extnamecol == 0) {
        strcpy(ttype[(int)xtension._8_4_],version + 0xb);
        strcpy(tform[(int)xtension._8_4_],version + 7);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      if (extvercol == 0) {
        strcpy(ttype[(int)xtension._8_4_],local_5d + 3);
        strcpy(tform[(int)xtension._8_4_],local_5d);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      break;
    case 2:
      if (positioncol == 0) {
        strcpy(*ttype,local_7b + 3);
        strcpy(*tform,local_7b);
      }
      xtension[9] = '\0';
      xtension[10] = '\0';
      xtension[0xb] = '\0';
      xtension[8] = positioncol == 0;
      break;
    case 3:
      if (xtensioncol == 0) {
        strcpy(*ttype,name + 7);
        strcpy(*tform,name + 4);
      }
      xtension[9] = '\0';
      xtension[10] = '\0';
      xtension[0xb] = '\0';
      xtension[8] = xtensioncol == 0;
      if (extnamecol == 0) {
        strcpy(ttype[(int)xtension._8_4_],version + 0xb);
        strcpy(tform[(int)xtension._8_4_],version + 7);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      if (extvercol == 0) {
        strcpy(ttype[(int)xtension._8_4_],local_5d + 3);
        strcpy(tform[(int)xtension._8_4_],local_5d);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      if (positioncol == 0) {
        strcpy(ttype[(int)xtension._8_4_],local_7b + 3);
        strcpy(tform[(int)xtension._8_4_],local_7b);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      break;
    default:
      *status = 0x15b;
      ffpmsg("Invalid value specified for the grouptype parameter (ffgtdc)");
      break;
    case 0xb:
      if (xtensioncol == 0) {
        strcpy(*ttype,name + 7);
        strcpy(*tform,name + 4);
      }
      xtension[9] = '\0';
      xtension[10] = '\0';
      xtension[0xb] = '\0';
      xtension[8] = xtensioncol == 0;
      if (extnamecol == 0) {
        strcpy(ttype[(int)xtension._8_4_],version + 0xb);
        strcpy(tform[(int)xtension._8_4_],version + 7);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      if (extvercol == 0) {
        strcpy(ttype[(int)xtension._8_4_],local_5d + 3);
        strcpy(tform[(int)xtension._8_4_],local_5d);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      if (locationcol == 0) {
        strcpy(ttype[(int)xtension._8_4_],local_bd + 5);
        strcpy(tform[(int)xtension._8_4_],local_bd);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      if (uricol == 0) {
        strcpy(ttype[(int)xtension._8_4_],local_9b + 3);
        strcpy(tform[(int)xtension._8_4_],local_9b);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      break;
    case 0xc:
      if (positioncol == 0) {
        strcpy(*ttype,local_7b + 3);
        strcpy(*tform,local_7b);
      }
      xtension[9] = '\0';
      xtension[10] = '\0';
      xtension[0xb] = '\0';
      xtension[8] = positioncol == 0;
      if (locationcol == 0) {
        strcpy(ttype[(int)xtension._8_4_],local_bd + 5);
        strcpy(tform[(int)xtension._8_4_],local_bd);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
      if (uricol == 0) {
        strcpy(ttype[(int)xtension._8_4_],local_9b + 3);
        strcpy(tform[(int)xtension._8_4_],local_9b);
        xtension._8_4_ = xtension._8_4_ + 1;
      }
    }
    *ncols = xtension._8_4_;
    xtensioncol_local = *status;
  }
  else {
    xtensioncol_local = *status;
  }
  return xtensioncol_local;
}

Assistant:

int ffgtdc(int   grouptype,     /* code specifying the type of
				   grouping table information:
				   GT_ID_ALL_URI  0 ==> defualt (all columns)
				   GT_ID_REF      1 ==> ID by reference
				   GT_ID_POS      2 ==> ID by position
				   GT_ID_ALL      3 ==> ID by ref. and position
				   GT_ID_REF_URI 11 ==> (1) + URI info 
				   GT_ID_POS_URI 12 ==> (2) + URI info       */
	   int   xtensioncol, /* does MEMBER_XTENSION already exist?         */
	   int   extnamecol,  /* does MEMBER_NAME aleady exist?              */
	   int   extvercol,   /* does MEMBER_VERSION already exist?          */
	   int   positioncol, /* does MEMBER_POSITION already exist?         */
	   int   locationcol, /* does MEMBER_LOCATION already exist?         */
	   int   uricol,      /* does MEMBER_URI_TYPE aleardy exist?         */
	   char *ttype[],     /* array of grouping table column TTYPE names
				 to define (if *col var false)               */
	   char *tform[],     /* array of grouping table column TFORM values
				 to define (if*col variable false)           */
	   int  *ncols,       /* number of TTYPE and TFORM values returned   */
	   int  *status)      /* return status code                          */

/*
  create the TTYPE and TFORM values for the grouping table according to the
  value of the grouptype parameter and the values of the *col flags. The
  resulting TTYPE and TFORM are returned in ttype[] and tform[] respectively.
  The number of TTYPE and TFORMs returned is given by ncols. Both the TTYPE[]
  and TTFORM[] arrays must contain enough pre-allocated strings to hold
  the returned information.
*/

{

  int i = 0;

  char  xtension[]  = "MEMBER_XTENSION";
  char  xtenTform[] = "8A";
  
  char  name[]      = "MEMBER_NAME";
  char  nameTform[] = "32A";

  char  version[]   = "MEMBER_VERSION";
  char  verTform[]  = "1J";
  
  char  position[]  = "MEMBER_POSITION";
  char  posTform[]  = "1J";

  char  URI[]       = "MEMBER_URI_TYPE";
  char  URITform[]  = "3A";

  char  location[]  = "MEMBER_LOCATION";
  /* SPR 01720, move from 160A to 256A */
  char  locTform[]  = "256A";


  if(*status != 0) return(*status);

  switch(grouptype)
    {
      
    case GT_ID_ALL_URI:

      if(xtensioncol == 0)
	{
	  strcpy(ttype[i],xtension);
	  strcpy(tform[i],xtenTform);
	  ++i;
	}
      if(extnamecol == 0)
	{
	  strcpy(ttype[i],name);
	  strcpy(tform[i],nameTform);
	  ++i;
	}
      if(extvercol == 0)
	{
	  strcpy(ttype[i],version);
	  strcpy(tform[i],verTform);
	  ++i;
	}
      if(positioncol == 0)
	{
	  strcpy(ttype[i],position);
	  strcpy(tform[i],posTform);
	  ++i;
	}
      if(locationcol == 0)
	{
	  strcpy(ttype[i],location);
	  strcpy(tform[i],locTform);
	  ++i;
	}
      if(uricol == 0)
	{
	  strcpy(ttype[i],URI);
	  strcpy(tform[i],URITform);
	  ++i;
	}
      break;
      
    case GT_ID_REF:
      
      if(xtensioncol == 0)
	{
	  strcpy(ttype[i],xtension);
	  strcpy(tform[i],xtenTform);
	  ++i;
	}
      if(extnamecol == 0)
	{
	  strcpy(ttype[i],name);
	  strcpy(tform[i],nameTform);
	  ++i;
	}
      if(extvercol == 0)
	{
	  strcpy(ttype[i],version);
	  strcpy(tform[i],verTform);
	  ++i;
	}
      break;
      
    case GT_ID_POS:
      
      if(positioncol == 0)
	{
	  strcpy(ttype[i],position);
	  strcpy(tform[i],posTform);
	  ++i;
	}	  
      break;
      
    case GT_ID_ALL:
      
      if(xtensioncol == 0)
	{
	  strcpy(ttype[i],xtension);
	  strcpy(tform[i],xtenTform);
	  ++i;
	}
      if(extnamecol == 0)
	{
	  strcpy(ttype[i],name);
	  strcpy(tform[i],nameTform);
	  ++i;
	}
      if(extvercol == 0)
	{
	  strcpy(ttype[i],version);
	  strcpy(tform[i],verTform);
	  ++i;
	}
      if(positioncol == 0)
	{
	  strcpy(ttype[i],position);
	  strcpy(tform[i], posTform);
	  ++i;
	}	  
      
      break;
      
    case GT_ID_REF_URI:
      
      if(xtensioncol == 0)
	{
	  strcpy(ttype[i],xtension);
	  strcpy(tform[i],xtenTform);
	  ++i;
	}
      if(extnamecol == 0)
	{
	  strcpy(ttype[i],name);
	  strcpy(tform[i],nameTform);
	  ++i;
	}
      if(extvercol == 0)
	{
	  strcpy(ttype[i],version);
	  strcpy(tform[i],verTform);
	  ++i;
	}
      if(locationcol == 0)
	{
	  strcpy(ttype[i],location);
	  strcpy(tform[i],locTform);
	  ++i;
	}
      if(uricol == 0)
	{
	  strcpy(ttype[i],URI);
	  strcpy(tform[i],URITform);
	  ++i;
	}
      break;
      
    case GT_ID_POS_URI:
      
      if(positioncol == 0)
	{
	  strcpy(ttype[i],position);
	  strcpy(tform[i],posTform);
	  ++i;
	}
      if(locationcol == 0)
	{
	  strcpy(ttype[i],location);
	  strcpy(tform[i],locTform);
	  ++i;
	}
      if(uricol == 0)
	{
	  strcpy(ttype[i],URI);
	  strcpy(tform[i],URITform);
	  ++i;
	}
      break;
      
    default:
      
      *status = BAD_OPTION;
      ffpmsg("Invalid value specified for the grouptype parameter (ffgtdc)");

      break;

    }

  *ncols = i;
  
  return(*status);
}